

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PcacheRelease(PgHdr *p)

{
  int *piVar1;
  i16 *piVar2;
  
  piVar1 = &p->pCache->nRefSum;
  *piVar1 = *piVar1 + -1;
  piVar2 = &p->nRef;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    if ((p->flags & 1) != 0) {
      if (p->pCache->bPurgeable != '\0') {
        (*sqlite3Config.pcache2.xUnpin)(p->pCache->pCache,p->pPage,0);
        return;
      }
      return;
    }
    if (p->pDirtyPrev != (PgHdr *)0x0) {
      pcacheManageDirtyList(p,'\x03');
      return;
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3PcacheRelease(PgHdr *p){
  assert( p->nRef>0 );
  p->pCache->nRefSum--;
  if( (--p->nRef)==0 ){
    if( p->flags&PGHDR_CLEAN ){
      pcacheUnpin(p);
    }else if( p->pDirtyPrev!=0 ){ /*OPTIMIZATION-IF-FALSE*/
      /* Move the page to the head of the dirty list. If p->pDirtyPrev==0,
      ** then page p is already at the head of the dirty list and the
      ** following call would be a no-op. Hence the OPTIMIZATION-IF-FALSE
      ** tag above.  */
      pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
    }
  }
}